

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bezier-test-tools.cpp
# Opt level: O0

void __thiscall bezier::test::fuzzyCheckPoint(test *this,Point p,double x,double y,double epsilon)

{
  MessageBuilder *pMVar1;
  WithinAbsMatcher *pWVar2;
  WithinAbsMatcher local_2a8;
  MatchExpr<const_double_&,_Catch::Matchers::WithinAbsMatcher> local_270;
  StringRef local_250;
  undefined1 local_240 [32];
  undefined1 local_220 [8];
  AssertionHandler catchAssertionHandler_1;
  MatchExpr<const_double_&,_Catch::Matchers::WithinAbsMatcher> local_1a0;
  StringRef local_180;
  undefined1 local_170 [32];
  undefined1 local_150 [8];
  AssertionHandler catchAssertionHandler;
  SourceLineInfo local_f8;
  StringRef local_e8;
  MessageBuilder local_d8;
  undefined1 local_80 [8];
  ScopedMessage scopedMessage1;
  double epsilon_local;
  double y_local;
  double x_local;
  Point p_local;
  
  p_local.x = p.y;
  x_local = p.x;
  scopedMessage1._72_8_ = epsilon;
  epsilon_local = y;
  y_local = x;
  local_e8 = operator____catch_sr("INFO",4);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_f8,
             "/workspace/llm4binary/github/license_c_cmakelists/oysteinmyrmo[P]bezier/tests/bezier-test-tools.cpp"
             ,5);
  Catch::MessageBuilder::MessageBuilder(&local_d8,local_e8,&local_f8,Info);
  pMVar1 = Catch::MessageBuilder::operator<<(&local_d8,(char (*) [27])"Failure: fuzzyCheckPoint((");
  pMVar1 = Catch::MessageBuilder::operator<<(pMVar1,&x_local);
  pMVar1 = Catch::MessageBuilder::operator<<(pMVar1,(char (*) [2])",");
  pMVar1 = Catch::MessageBuilder::operator<<(pMVar1,&p_local.x);
  pMVar1 = Catch::MessageBuilder::operator<<(pMVar1,(char (*) [4])"), ");
  pMVar1 = Catch::MessageBuilder::operator<<(pMVar1,&y_local);
  pMVar1 = Catch::MessageBuilder::operator<<(pMVar1,(char (*) [3])0x31608b);
  pMVar1 = Catch::MessageBuilder::operator<<(pMVar1,&epsilon_local);
  pMVar1 = Catch::MessageBuilder::operator<<(pMVar1,(char (*) [3])0x31608b);
  pMVar1 = Catch::MessageBuilder::operator<<(pMVar1,(double *)&scopedMessage1.m_moved);
  pMVar1 = Catch::MessageBuilder::operator<<(pMVar1,(char (*) [3])");");
  Catch::ScopedMessage::ScopedMessage((ScopedMessage *)local_80,pMVar1);
  Catch::MessageBuilder::~MessageBuilder(&local_d8);
  local_170._16_16_ = (undefined1  [16])operator____catch_sr("CHECK_THAT",10);
  pWVar2 = (WithinAbsMatcher *)local_170;
  Catch::SourceLineInfo::SourceLineInfo
            ((SourceLineInfo *)pWVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/oysteinmyrmo[P]bezier/tests/bezier-test-tools.cpp"
             ,6);
  local_180 = operator____catch_sr("p.x, Catch::Matchers::WithinAbs(x, epsilon)",0x2b);
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_150,(StringRef)local_170._16_16_,(SourceLineInfo *)pWVar2,
             local_180,ContinueOnFailure);
  Catch::Matchers::WithinAbs
            ((WithinAbsMatcher *)&catchAssertionHandler_1.m_resultCapture,y_local,
             (double)scopedMessage1._72_8_);
  Catch::makeMatchExpr<double_const&,Catch::Matchers::WithinAbsMatcher>
            (&local_1a0,(Catch *)&x_local,(double *)&catchAssertionHandler_1.m_resultCapture,pWVar2)
  ;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_150,&local_1a0.super_ITransientExpression);
  Catch::MatchExpr<const_double_&,_Catch::Matchers::WithinAbsMatcher>::~MatchExpr(&local_1a0);
  Catch::Matchers::WithinAbsMatcher::~WithinAbsMatcher
            ((WithinAbsMatcher *)&catchAssertionHandler_1.m_resultCapture);
  Catch::AssertionHandler::complete((AssertionHandler *)local_150);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_150);
  local_240._16_16_ = (undefined1  [16])operator____catch_sr("CHECK_THAT",10);
  pWVar2 = (WithinAbsMatcher *)local_240;
  Catch::SourceLineInfo::SourceLineInfo
            ((SourceLineInfo *)pWVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/oysteinmyrmo[P]bezier/tests/bezier-test-tools.cpp"
             ,7);
  local_250 = operator____catch_sr("p.y, Catch::Matchers::WithinAbs(y, epsilon)",0x2b);
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_220,(StringRef)local_240._16_16_,(SourceLineInfo *)pWVar2,
             local_250,ContinueOnFailure);
  Catch::Matchers::WithinAbs(&local_2a8,epsilon_local,(double)scopedMessage1._72_8_);
  Catch::makeMatchExpr<double_const&,Catch::Matchers::WithinAbsMatcher>
            (&local_270,(Catch *)&p_local,(double *)&local_2a8,pWVar2);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_220,&local_270.super_ITransientExpression);
  Catch::MatchExpr<const_double_&,_Catch::Matchers::WithinAbsMatcher>::~MatchExpr(&local_270);
  Catch::Matchers::WithinAbsMatcher::~WithinAbsMatcher(&local_2a8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_220);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_220);
  Catch::ScopedMessage::~ScopedMessage((ScopedMessage *)local_80);
  return;
}

Assistant:

void bezier::test::fuzzyCheckPoint(const ::bezier::Point p, const double x, const double y, const double epsilon)
{
    INFO("Failure: fuzzyCheckPoint((" << p.x << "," << p.y << "), " << x << ", " << y << ", " << epsilon << ");");
    CHECK_THAT(p.x, Catch::Matchers::WithinAbs(x, epsilon));
    CHECK_THAT(p.y, Catch::Matchers::WithinAbs(y, epsilon));
}